

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *
pbrt::Image::GenerateMIPMap(Image *image,WrapMode2D wrapMode,Allocator alloc)

{
  span<const_float> buf;
  LogLevel LVar1;
  bool bVar2;
  int *piVar3;
  int *__b;
  reference p1;
  pointer ptr;
  ColorEncodingHandle *in_RCX;
  undefined8 in_RDX;
  Bounds2i *in_RSI;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RDI;
  Tuple2<pbrt::Point2,_int> *this;
  int srcDeltas [4];
  Image nextImage;
  Point2i nextResolution;
  int i;
  Point2i levelResolution;
  int nLevels;
  ColorEncodingHandle origEncoding;
  int nChannels;
  PixelFormat origFormat;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *pyramid;
  Image *in_stack_fffffffffffff7b8;
  ColorEncodingHandle *pCVar4;
  Image *in_stack_fffffffffffff7c0;
  Image *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  undefined4 uVar5;
  size_t in_stack_fffffffffffff7d8;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_stack_fffffffffffff7e0;
  char (*in_stack_fffffffffffff800) [51];
  int *in_stack_fffffffffffff808;
  int *in_stack_fffffffffffff810;
  int line;
  int *in_stack_fffffffffffff818;
  LogLevel in_stack_fffffffffffff824;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  undefined8 in_stack_fffffffffffff860;
  PixelFormat newFormat;
  Image *in_stack_fffffffffffff868;
  function<void_(long,_long)> *in_stack_fffffffffffff8a0;
  Tuple2<pbrt::Point2,_int> *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  int32_t in_stack_fffffffffffff8b4;
  undefined4 in_stack_fffffffffffff8d8;
  PixelFormat in_stack_fffffffffffff8dc;
  Image *in_stack_fffffffffffff8e0;
  Allocator in_stack_fffffffffffff8e8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8f0;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff900;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff908;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff910;
  int local_54c [3];
  Image *local_540;
  Tuple2<pbrt::Point2,_int> local_520;
  int local_400 [3];
  int local_3f4;
  Tuple2<pbrt::Point2,_int> local_3f0;
  ColorEncodingHandle *local_3e8;
  Tuple2<pbrt::Point2,_int> local_3c8;
  int local_2a4;
  Tuple2<pbrt::Point2,_int> local_2a0;
  polymorphic_allocator<pbrt::Image> local_298;
  undefined1 local_28d;
  int local_28c;
  function<void_(long,_long)> local_280 [9];
  undefined8 local_158;
  LogLevel local_28;
  undefined4 local_24;
  ColorEncodingHandle *local_18;
  undefined8 local_10;
  
  newFormat = (PixelFormat)((ulong)in_stack_fffffffffffff860 >> 0x20);
  local_24 = (undefined4)
             ((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               *)&in_RSI->pMin)->bits;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_28 = NChannels((Image *)0x4bb8db);
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)in_stack_fffffffffffff7c0,
             (ColorEncodingHandle *)in_stack_fffffffffffff7b8);
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[]
                     ((Tuple2<pbrt::Point2,_int> *)
                      ((long)&((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                                *)&in_RSI->pMin)->bits + 4),0);
  bVar2 = IsPowerOf2<int>(*piVar3);
  if (bVar2) {
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[]
                       ((Tuple2<pbrt::Point2,_int> *)
                        ((long)&((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                                  *)&in_RSI->pMin)->bits + 4),1);
    bVar2 = IsPowerOf2<int>(*piVar3);
    if (bVar2) {
      bVar2 = Is32Bit((PixelFormat)
                      ((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                        *)&in_RSI->pMin)->bits);
      if (!bVar2) {
        ColorEncodingHandle::TaggedPointer
                  ((ColorEncodingHandle *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
        in_stack_fffffffffffff8a0 = local_280;
        ConvertToFormat(in_stack_fffffffffffff868,newFormat,
                        (ColorEncodingHandle *)
                        CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        operator=(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
        ~Image(in_stack_fffffffffffff7c0);
      }
      goto LAB_004bbacf;
    }
  }
  in_stack_fffffffffffff8a8 =
       (Tuple2<pbrt::Point2,_int> *)
       ((long)&((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 *)&in_RSI->pMin)->bits + 4);
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[](in_stack_fffffffffffff8a8,0);
  in_stack_fffffffffffff8b4 = RoundUpPow2(*piVar3);
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[](in_stack_fffffffffffff8a8,1);
  RoundUpPow2(*piVar3);
  Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff7c0,
                      (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(int)in_stack_fffffffffffff7b8
                     );
  local_158 = local_10;
  FloatResize((Image *)in_stack_fffffffffffff900,(Point2i)in_stack_fffffffffffff910,
              (WrapMode2D)in_stack_fffffffffffff908.values);
  operator=(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  ~Image(in_stack_fffffffffffff7c0);
LAB_004bbacf:
  bVar2 = Is32Bit((PixelFormat)
                  ((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                    *)&in_RSI->pMin)->bits);
  if (!bVar2) {
    LogFatal<char_const(&)[22]>
              (in_stack_fffffffffffff824,(char *)in_stack_fffffffffffff818,
               (int)((ulong)in_stack_fffffffffffff810 >> 0x20),(char *)in_stack_fffffffffffff808,
               (char (*) [22])in_stack_fffffffffffff800);
  }
  this = (Tuple2<pbrt::Point2,_int> *)
         ((long)&((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   *)&in_RSI->pMin)->bits + 4);
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[](this,0);
  __b = Tuple2<pbrt::Point2,_int>::operator[](this,1);
  std::max<int>(piVar3,__b);
  local_28c = Log2Int(0);
  local_28c = local_28c + 1;
  local_28d = 0;
  pstd::pmr::polymorphic_allocator<pbrt::Image>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Image> *)in_stack_fffffffffffff7c0,
             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff7b8);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::vector
            (in_RDI,&local_298);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  local_2a0 = *(Tuple2<pbrt::Point2,_int> *)
               ((long)&((TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                         *)&in_RSI->pMin)->bits + 4);
  for (local_2a4 = 0; line = (int)((ulong)in_stack_fffffffffffff810 >> 0x20),
      local_2a4 < local_28c + -1; local_2a4 = local_2a4 + 1) {
    local_3c8 = local_2a0;
    pstd::span<std::__cxx11::string_const>::
    span<pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,void,pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff7c8);
    ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffff7c0,
               (ColorEncodingHandle *)in_stack_fffffffffffff7b8);
    local_3e8 = local_18;
    pCVar4 = local_18;
    Image(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,(Point2i)in_stack_fffffffffffff900,
          in_stack_fffffffffffff8f0,(ColorEncodingHandle *)in_RSI,in_stack_fffffffffffff8e8);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
              ((vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *)
               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               in_stack_fffffffffffff7c8);
    ~Image(in_stack_fffffffffffff7c0);
    local_3f4 = 1;
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,0);
    local_400[2] = *piVar3 / 2;
    std::max<int>(&local_3f4,local_400 + 2);
    local_400[1] = 1;
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,1);
    local_400[0] = *piVar3 / 2;
    std::max<int>(local_400 + 1,local_400);
    Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff7c0,(int)((ulong)pCVar4 >> 0x20),
                        (int)pCVar4);
    local_520 = local_3f0;
    pstd::span<std::__cxx11::string_const>::
    span<pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,void,pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff7c8);
    ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffff7c0,pCVar4);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff7c0);
    in_stack_fffffffffffff7b8 = local_540;
    Image(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,(Point2i)in_stack_fffffffffffff900,
          in_stack_fffffffffffff8f0,(ColorEncodingHandle *)in_RSI,in_stack_fffffffffffff8e8);
    Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,0);
    in_stack_fffffffffffff818 = local_54c;
    in_stack_fffffffffffff824 = local_28;
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,0);
    *in_stack_fffffffffffff818 = in_stack_fffffffffffff824 * *piVar3 + local_28;
    in_stack_fffffffffffff810 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,0);
    if (*in_stack_fffffffffffff810 == 1) {
      local_54c[0] = local_54c[0] - local_28;
    }
    in_stack_fffffffffffff808 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,1);
    LVar1 = local_28;
    if (*in_stack_fffffffffffff808 == 1) {
      in_stack_fffffffffffff800 = (char (*) [51])Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,0)
      ;
      local_54c[0] = local_54c[0] - LVar1 * *(int *)*in_stack_fffffffffffff800;
    }
    Tuple2<pbrt::Point2,_int>::operator[](&local_3f0,1);
    std::function<void(long,long)>::
    function<pbrt::Image::GenerateMIPMap(pbrt::Image,pbrt::WrapMode2D,pstd::pmr::polymorphic_allocator<std::byte>)::__0,void>
              ((function<void_(long,_long)> *)
               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (anon_class_64_8_51c439d7 *)in_stack_fffffffffffff7c8);
    ParallelFor(CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                (int64_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x4bc0cf);
    operator=(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    local_2a0 = local_3f0;
    ~Image(in_stack_fffffffffffff7c0);
  }
  piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,0);
  if ((*piVar3 == 1) && (piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_2a0,1), *piVar3 == 1)
     ) {
    uVar5 = local_24;
    pstd::span<std::__cxx11::string_const>::
    span<pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,void,pbrt::InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(local_24,in_stack_fffffffffffff7d0),
               (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff7c8);
    ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffff7c0,
               (ColorEncodingHandle *)in_stack_fffffffffffff7b8);
    Image(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,(Point2i)in_stack_fffffffffffff900,
          in_stack_fffffffffffff8f0,(ColorEncodingHandle *)in_RSI,in_stack_fffffffffffff8e8);
    pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::push_back
              ((vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *)
               CONCAT44(uVar5,in_stack_fffffffffffff7d0),in_stack_fffffffffffff7c8);
    ~Image(in_stack_fffffffffffff7c0);
    p1 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator[]
                   (in_RDI,(long)(local_28c + -1));
    Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff7c0,(int)((ulong)local_18 >> 0x20),
                        (int)local_18);
    Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff7c0,(int)((ulong)local_18 >> 0x20),
                        (int)local_18);
    Bounds2<int>::Bounds2
              ((Bounds2<int> *)CONCAT44(uVar5,in_stack_fffffffffffff7d0),(Point2<int> *)p1,
               (Point2<int> *)in_stack_fffffffffffff7c0);
    ptr = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&in_RSI[0xf].pMax);
    pstd::span<const_float>::span
              ((span<const_float> *)&stack0xfffffffffffff8d8,ptr,(long)(int)local_28);
    buf.n = (size_t)in_stack_fffffffffffff8e8.memoryResource;
    buf.ptr = (float *)in_stack_fffffffffffff8e0;
    CopyRectIn((Image *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),in_RSI,buf);
    return in_RDI;
  }
  LogFatal<char_const(&)[51]>
            (in_stack_fffffffffffff824,(char *)in_stack_fffffffffffff818,line,
             (char *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
}

Assistant:

pstd::vector<Image> Image::GenerateMIPMap(Image image, WrapMode2D wrapMode,
                                          Allocator alloc) {
    PixelFormat origFormat = image.format;
    int nChannels = image.NChannels();
    ColorEncodingHandle origEncoding = image.encoding;

    // Set things up so we have a power-of-two sized image stored with
    // floats.
    if (!IsPowerOf2(image.resolution[0]) || !IsPowerOf2(image.resolution[1])) {
        // Resample image to power-of-two resolution
        image = image.FloatResize(
            {RoundUpPow2(image.resolution[0]), RoundUpPow2(image.resolution[1])},
            wrapMode);
    } else if (!Is32Bit(image.format))
        image = image.ConvertToFormat(PixelFormat::Float);
    CHECK(Is32Bit(image.format));

    // Initialize levels of MIPMap from image
    int nLevels = 1 + Log2Int(std::max(image.resolution[0], image.resolution[1]));
    pstd::vector<Image> pyramid(alloc);
    pyramid.reserve(nLevels);

    Point2i levelResolution = image.resolution;
    for (int i = 0; i < nLevels - 1; ++i) {
        // Initialize $i+1$st MIPMap level from $i$th level and also convert
        // i'th level to the internal format
        pyramid.push_back(
            Image(origFormat, levelResolution, image.channelNames, origEncoding, alloc));

        Point2i nextResolution(std::max(1, levelResolution[0] / 2),
                               std::max(1, levelResolution[1] / 2));
        Image nextImage(image.format, nextResolution, image.channelNames, origEncoding);

        // Offsets from the base pixel to the four neighbors that we'll
        // downfilter.
        int srcDeltas[4] = {0, nChannels, nChannels * levelResolution[0],
                            nChannels * levelResolution[0] + nChannels};
        // Clamp offsets once a dimension has a single texel.
        if (levelResolution[0] == 1) {
            srcDeltas[1] = 0;
            srcDeltas[3] -= nChannels;
        }
        if (levelResolution[1] == 1) {
            srcDeltas[2] = 0;
            srcDeltas[3] -= nChannels * levelResolution[0];
        }

        // Work in scanlines for best cache coherence (vs 2d tiles).
        ParallelFor(0, nextResolution[1], [&](int64_t y0, int64_t y1) {
            for (int y = y0; y < y1; ++y) {
                // Downfilter with a box filter for the next MIP level
                int srcOffset = image.PixelOffset({0, 2 * y});
                int nextOffset = nextImage.PixelOffset({0, y});
                for (int x = 0; x < nextResolution[0]; ++x) {
                    for (int c = 0; c < nChannels; ++c) {
                        nextImage.p32[nextOffset] =
                            .25f *
                            (image.p32[srcOffset] + image.p32[srcOffset + srcDeltas[1]] +
                             image.p32[srcOffset + srcDeltas[2]] +
                             image.p32[srcOffset + srcDeltas[3]]);
                        ++srcOffset;
                        ++nextOffset;
                    }
                    srcOffset += nChannels;
                }

                // Copy the current level out to the current pyramid level
                int yStart = 2 * y;
                int yEnd = std::min(2 * y + 2, levelResolution[1]);
                int offset = image.PixelOffset({0, yStart});
                size_t count = (yEnd - yStart) * nChannels * levelResolution[0];
                pyramid[i].CopyRectIn(Bounds2i({0, yStart}, {levelResolution[0], yEnd}),
                                      {image.p32.data() + offset, count});
            }
        });

        image = std::move(nextImage);
        levelResolution = nextResolution;
    }

    // Top level
    CHECK(levelResolution[0] == 1 && levelResolution[1] == 1);
    pyramid.push_back(
        Image(origFormat, levelResolution, image.channelNames, origEncoding, alloc));
    pyramid[nLevels - 1].CopyRectIn({{0, 0}, {1, 1}},
                                    {image.p32.data(), size_t(nChannels)});

    return pyramid;
}